

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int tx_from_bytes(uchar *bytes,size_t bytes_len,uint32_t flags,wally_tx **output)

{
  uint uVar1;
  uint64_t uVar2;
  wally_tx *pwVar3;
  _Bool _Var4;
  undefined4 uVar5;
  int iVar6;
  undefined8 in_RAX;
  undefined7 uVar9;
  size_t sVar7;
  byte *pbVar8;
  uchar *nonce;
  uchar *puVar10;
  byte bVar11;
  uint32_t index;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  uchar *puVar12;
  ulong uVar13;
  uint32_t *bytes_00;
  undefined1 free_parent;
  wally_tx_witness_stack **ppwVar14;
  ulong uVar15;
  uint64_t uVar16;
  uchar *bytes_01;
  long lVar17;
  byte *pbVar18;
  uint32_t *puVar19;
  byte *pbVar20;
  uchar *puVar21;
  bool bVar22;
  uint64_t tmp;
  undefined8 local_a0;
  uint64_t issuance_amount_len;
  uint64_t num_witnesses;
  wally_tx *local_88;
  uint64_t inflation_keys_len;
  uint local_74;
  uchar *local_70;
  uchar *local_68;
  uint64_t local_60;
  uint64_t nonce_len;
  wally_tx **local_50;
  uint32_t local_48;
  uint local_44;
  long local_40;
  uchar *local_38;
  
  if (output == (wally_tx **)0x0) {
    return -2;
  }
  *output = (wally_tx *)0x0;
  uVar9 = (undefined7)((ulong)in_RAX >> 8);
  if (0xf < flags || (bytes_len < 6 || bytes == (uchar *)0x0)) {
    return -2;
  }
  if ((flags & 2) == 0) {
    pbVar18 = bytes + 4;
    if ((7 < flags) || (*pbVar18 != 0)) {
      local_a0 = (uchar *)((ulong)local_a0._4_4_ << 0x20);
      goto LAB_0010e65f;
    }
    if (bytes[5] != '\x01') {
      return -2;
    }
    pbVar18 = bytes + 6;
    uVar5 = (undefined4)CONCAT71(uVar9,1);
  }
  else {
    if (7 < flags) {
      return -2;
    }
    pbVar18 = bytes + 5;
    uVar5 = (undefined4)CONCAT71(uVar9,bytes[4] != '\0');
  }
  local_a0 = (uchar *)CONCAT44(local_a0._4_4_,uVar5);
LAB_0010e65f:
  pbVar20 = bytes + bytes_len;
  if (pbVar20 < pbVar18) {
    return -2;
  }
  local_50 = output;
  sVar7 = varint_length_from_bytes(pbVar18);
  if (pbVar20 < pbVar18 + sVar7) {
    return -2;
  }
  sVar7 = varint_from_bytes(pbVar18,&tmp);
  pbVar18 = pbVar18 + sVar7;
  local_68 = (uchar *)tmp;
  uVar13 = extraout_RDX;
  uVar16 = tmp;
  while (bVar22 = uVar16 != 0, uVar16 = uVar16 - 1, bVar22) {
    if (pbVar20 < pbVar18) {
      return -2;
    }
    pbVar8 = pbVar18 + 0x24;
    if (pbVar20 < pbVar8) {
      return -2;
    }
    bVar22 = false;
    if (((flags & 2) != 0) && ((int)*(uint *)(pbVar18 + 0x20) < 0)) {
      _Var4 = is_coinbase_bytes(pbVar18,(ulong)*(uint *)(pbVar18 + 0x20),(uint32_t)uVar13);
      bVar22 = !_Var4;
    }
    sVar7 = varint_length_from_bytes(pbVar8);
    if (pbVar20 < pbVar8 + sVar7) {
      return -2;
    }
    sVar7 = varint_from_bytes(pbVar8,&tmp);
    if (pbVar20 < pbVar8 + sVar7) {
      return -2;
    }
    pbVar8 = pbVar8 + sVar7 + tmp;
    if (pbVar20 < pbVar8) {
      return -2;
    }
    pbVar18 = pbVar8 + 4;
    if (pbVar20 < pbVar18) {
      return -2;
    }
    uVar13 = extraout_RDX_00;
    if (bVar22) {
      if (pbVar20 < pbVar8 + 0x44) {
        return -2;
      }
      bVar11 = pbVar8[0x44];
      if (bVar11 - 8 < 2) {
        pbVar8 = pbVar8 + 0x65;
      }
      else if (bVar11 == 1) {
        pbVar8 = pbVar8 + 0x4d;
      }
      else {
        if (bVar11 != 0) {
          return -2;
        }
        pbVar8 = pbVar8 + 0x45;
      }
      if (pbVar20 < pbVar8) {
        return -2;
      }
      bVar11 = *pbVar8;
      uVar13 = (ulong)(bVar11 - 8);
      if (bVar11 - 8 < 2) {
        pbVar18 = pbVar8 + 0x21;
      }
      else if (bVar11 == 1) {
        pbVar18 = pbVar8 + 9;
      }
      else {
        if (bVar11 != 0) {
          return -2;
        }
        pbVar18 = pbVar8 + 1;
      }
      if (pbVar20 < pbVar18) {
        return -2;
      }
    }
  }
  if (pbVar20 < pbVar18) {
    return -2;
  }
  sVar7 = varint_length_from_bytes(pbVar18);
  if (pbVar20 < pbVar18 + sVar7) {
    return -2;
  }
  sVar7 = varint_from_bytes(pbVar18,&tmp);
  pbVar18 = pbVar18 + sVar7;
  uVar16 = 0xffffffffffffffff;
  local_60 = tmp;
  while (uVar16 = uVar16 + 1, local_60 != uVar16) {
    if ((flags & 2) == 0) {
      if (pbVar20 < pbVar18) {
        return -2;
      }
      pbVar18 = pbVar18 + 8;
    }
    else {
      bVar11 = *pbVar18;
      if ((bVar11 - 10 < 2) || (bVar11 == 1)) {
        if (pbVar20 < pbVar18) {
          return -2;
        }
        pbVar18 = pbVar18 + 0x21;
      }
      else {
        if (bVar11 != 0) {
          return -2;
        }
        if (pbVar20 < pbVar18) {
          return -2;
        }
        pbVar18 = pbVar18 + 1;
      }
      if (pbVar20 < pbVar18) {
        return -2;
      }
      bVar11 = *pbVar18;
      if (bVar11 - 8 < 2) {
        pbVar18 = pbVar18 + 0x21;
      }
      else if (bVar11 == 1) {
        pbVar18 = pbVar18 + 9;
      }
      else {
        if (bVar11 != 0) {
          return -2;
        }
        pbVar18 = pbVar18 + 1;
      }
      if (pbVar20 < pbVar18) {
        return -2;
      }
      bVar11 = *pbVar18;
      if ((bVar11 - 2 < 2) || (bVar11 == 1)) {
        pbVar18 = pbVar18 + 0x21;
      }
      else {
        if (bVar11 != 0) {
          return -2;
        }
        pbVar18 = pbVar18 + 1;
      }
    }
    if (pbVar20 < pbVar18) {
      return -2;
    }
    sVar7 = varint_length_from_bytes(pbVar18);
    if (pbVar20 < pbVar18 + sVar7) {
      return -2;
    }
    sVar7 = varint_from_bytes(pbVar18,&tmp);
    if (pbVar20 < pbVar18 + sVar7) {
      return -2;
    }
    pbVar18 = pbVar18 + sVar7 + tmp;
    if (pbVar20 < pbVar18) {
      return -2;
    }
  }
  local_74 = (flags & 2) >> 1;
  bVar11 = (byte)local_a0 ^ 1;
  if ((char)local_74 == '\0' && bVar11 == 0) {
    for (puVar12 = (uchar *)0x0; puVar12 != local_68; puVar12 = puVar12 + 1) {
      if (pbVar20 < pbVar18) {
        return -2;
      }
      sVar7 = varint_length_from_bytes(pbVar18);
      if (pbVar20 < pbVar18 + sVar7) {
        return -2;
      }
      sVar7 = varint_from_bytes(pbVar18,&num_witnesses);
      pbVar18 = pbVar18 + sVar7;
      uVar13 = 0xffffffffffffffff;
      while (uVar13 = uVar13 + 1, uVar13 < num_witnesses) {
        if (pbVar20 < pbVar18) {
          return -2;
        }
        sVar7 = varint_length_from_bytes(pbVar18);
        if (pbVar20 < pbVar18 + sVar7) {
          return -2;
        }
        sVar7 = varint_from_bytes(pbVar18,&tmp);
        if (pbVar20 < pbVar18 + sVar7) {
          return -2;
        }
        pbVar18 = pbVar18 + sVar7 + tmp;
        if (pbVar20 < pbVar18) {
          return -2;
        }
      }
    }
  }
  iVar6 = -2;
  if ((pbVar18 <= pbVar20) && (pbVar18 = pbVar18 + 4, pbVar18 <= pbVar20)) {
    if ((flags & 2) != 0 && bVar11 == 0) {
      for (puVar12 = (uchar *)0x0; puVar12 != local_68; puVar12 = puVar12 + 1) {
        if (pbVar20 < pbVar18) {
          return -2;
        }
        sVar7 = varint_length_from_bytes(pbVar18);
        if (pbVar20 < pbVar18 + sVar7) {
          return -2;
        }
        sVar7 = varint_from_bytes(pbVar18,&tmp);
        if (pbVar20 < pbVar18 + sVar7) {
          return -2;
        }
        pbVar18 = pbVar18 + sVar7 + tmp;
        if (pbVar20 < pbVar18) {
          return -2;
        }
        sVar7 = varint_length_from_bytes(pbVar18);
        if (pbVar20 < pbVar18 + sVar7) {
          return -2;
        }
        sVar7 = varint_from_bytes(pbVar18,&tmp);
        if (pbVar20 < pbVar18 + sVar7) {
          return -2;
        }
        pbVar18 = pbVar18 + sVar7 + tmp;
        if (pbVar20 < pbVar18) {
          return -2;
        }
        sVar7 = varint_length_from_bytes(pbVar18);
        if (pbVar20 < pbVar18 + sVar7) {
          return -2;
        }
        sVar7 = varint_from_bytes(pbVar18,&num_witnesses);
        pbVar18 = pbVar18 + sVar7;
        uVar13 = 0xffffffffffffffff;
        while (uVar13 = uVar13 + 1, uVar13 < num_witnesses) {
          if (pbVar20 < pbVar18) {
            return -2;
          }
          sVar7 = varint_length_from_bytes(pbVar18);
          if (pbVar20 < pbVar18 + sVar7) {
            return -2;
          }
          sVar7 = varint_from_bytes(pbVar18,&tmp);
          if (pbVar20 < pbVar18 + sVar7) {
            return -2;
          }
          pbVar18 = pbVar18 + sVar7 + tmp;
          if (pbVar20 < pbVar18) {
            return -2;
          }
        }
        if (pbVar20 < pbVar18) {
          return -2;
        }
        sVar7 = varint_length_from_bytes(pbVar18);
        if (pbVar20 < pbVar18 + sVar7) {
          return -2;
        }
        sVar7 = varint_from_bytes(pbVar18,&num_witnesses);
        pbVar18 = pbVar18 + sVar7;
        uVar13 = 0xffffffffffffffff;
        while (uVar13 = uVar13 + 1, uVar13 < num_witnesses) {
          if (pbVar20 < pbVar18) {
            return -2;
          }
          sVar7 = varint_length_from_bytes(pbVar18);
          if (pbVar20 < pbVar18 + sVar7) {
            return -2;
          }
          sVar7 = varint_from_bytes(pbVar18,&tmp);
          if (pbVar20 < pbVar18 + sVar7) {
            return -2;
          }
          pbVar18 = pbVar18 + sVar7 + tmp;
          if (pbVar20 < pbVar18) {
            return -2;
          }
        }
      }
      lVar17 = local_60 + 1;
      while (lVar17 = lVar17 + -1, lVar17 != 0) {
        if (pbVar20 < pbVar18) {
          return -2;
        }
        sVar7 = varint_length_from_bytes(pbVar18);
        if (pbVar20 < pbVar18 + sVar7) {
          return -2;
        }
        sVar7 = varint_from_bytes(pbVar18,&tmp);
        if (pbVar20 < pbVar18 + sVar7) {
          return -2;
        }
        pbVar18 = pbVar18 + sVar7 + tmp;
        if (pbVar20 < pbVar18) {
          return -2;
        }
        sVar7 = varint_length_from_bytes(pbVar18);
        if (pbVar20 < pbVar18 + sVar7) {
          return -2;
        }
        sVar7 = varint_from_bytes(pbVar18,&tmp);
        if (pbVar20 < pbVar18 + sVar7) {
          return -2;
        }
        pbVar18 = pbVar18 + sVar7 + tmp;
        if (pbVar20 < pbVar18) {
          return -2;
        }
      }
    }
    iVar6 = wally_tx_init_alloc(0,0,(size_t)local_68,local_60,local_50);
    if (iVar6 == 0) {
      local_88 = *local_50;
      local_88->version = *(uint32_t *)bytes;
      lVar17 = 5;
      if ((flags & 2) == 0) {
        lVar17 = ((ulong)local_a0 & 0xff) * 2 + 4;
      }
      sVar7 = varint_from_bytes(bytes + lVar17,&tmp);
      local_a0 = bytes + lVar17 + sVar7;
      local_40 = 0;
      puVar12 = local_68;
      while (puVar21 = local_a0, local_38 = puVar12 + -1, puVar12 != (uchar *)0x0) {
        issuance_amount_len = 0;
        inflation_keys_len = 0;
        uVar1 = *(uint *)(local_a0 + 0x20);
        sVar7 = varint_from_bytes(local_a0 + 0x24,&num_witnesses);
        uVar16 = num_witnesses;
        puVar21 = puVar21 + sVar7 + 0x24;
        local_70 = puVar21 + num_witnesses + 4;
        local_48 = *(uint32_t *)(local_70 + -4);
        local_44 = uVar1;
        if ((((flags & 2) == 0) || (-1 < (int)uVar1)) ||
           (_Var4 = is_coinbase_bytes(local_a0,(ulong)uVar1,index), _Var4)) {
          puVar12 = (uchar *)0x0;
          puVar10 = (uchar *)0x0;
          bytes_01 = (uchar *)0x0;
          nonce = (uchar *)0x0;
        }
        else {
          puVar12 = puVar21 + uVar16 + 0x24;
          puVar10 = puVar21 + uVar16 + 0x44;
          sVar7 = confidential_value_varint_from_bytes(puVar10,&issuance_amount_len);
          bytes_01 = puVar21 + sVar7 + uVar16 + 0x44;
          sVar7 = confidential_value_varint_from_bytes(bytes_01,&inflation_keys_len);
          nonce = local_70;
          uVar16 = num_witnesses;
          local_70 = bytes_01 + sVar7;
        }
        lVar17 = local_40;
        pwVar3 = local_88;
        if (uVar16 == 0) {
          puVar21 = (uchar *)0x0;
        }
        if (issuance_amount_len == 0) {
          puVar10 = (uchar *)0x0;
        }
        if (inflation_keys_len == 0) {
          bytes_01 = (uchar *)0x0;
        }
        free_parent = 0x20;
        iVar6 = tx_elements_input_init
                          (local_a0,0x20,local_44,local_48,puVar21,uVar16,
                           (wally_tx_witness_stack *)0x0,nonce,(ulong)(nonce != (uchar *)0x0) << 5,
                           puVar12,(ulong)(puVar12 != (uchar *)0x0) << 5,puVar10,issuance_amount_len
                           ,bytes_01,inflation_keys_len,(uchar *)0x0,0,(uchar *)0x0,0,
                           (wally_tx_witness_stack *)0x0,
                           (wally_tx_input *)(local_88->inputs->txhash + local_40),SUB41(local_74,0)
                          );
        if (iVar6 != 0) goto LAB_0010f294;
        pwVar3->num_inputs = pwVar3->num_inputs + 1;
        local_40 = lVar17 + 0xd0;
        local_a0 = local_70;
        puVar12 = local_38;
      }
      sVar7 = varint_from_bytes(local_a0,&tmp);
      puVar19 = (uint32_t *)(puVar21 + sVar7);
      local_a0 = (uchar *)0x0;
      uVar16 = local_60;
      while (bVar22 = uVar16 != 0, uVar16 = uVar16 - 1, bVar22) {
        issuance_amount_len = 0;
        inflation_keys_len = 0;
        nonce_len = 0;
        if ((flags & 2) == 0) {
          local_70 = *(uchar **)puVar19;
          bytes_00 = puVar19 + 2;
          puVar19 = (uint32_t *)0x0;
          puVar12 = (uchar *)0x0;
          puVar21 = (uchar *)0x0;
        }
        else {
          sVar7 = confidential_asset_varint_from_bytes((uchar *)puVar19,&issuance_amount_len);
          puVar12 = (uchar *)(sVar7 + (long)puVar19);
          sVar7 = confidential_value_varint_from_bytes(puVar12,&inflation_keys_len);
          puVar21 = puVar12 + sVar7;
          sVar7 = confidential_nonce_varint_from_bytes(puVar21,&nonce_len);
          bytes_00 = (uint32_t *)(puVar21 + sVar7);
          local_70 = (uchar *)0xffffffffffffffff;
        }
        sVar7 = varint_from_bytes((uchar *)bytes_00,&num_witnesses);
        uVar2 = num_witnesses;
        puVar10 = (uchar *)(sVar7 + (long)bytes_00);
        if (num_witnesses == 0) {
          puVar10 = (uchar *)0x0;
        }
        if (issuance_amount_len == 0) {
          puVar19 = (uint32_t *)0x0;
        }
        if (inflation_keys_len == 0) {
          puVar12 = (uchar *)0x0;
        }
        if (nonce_len == 0) {
          puVar21 = (uchar *)0x0;
        }
        iVar6 = tx_elements_output_init
                          ((uint64_t)local_70,puVar10,num_witnesses,(uchar *)puVar19,
                           issuance_amount_len,puVar12,inflation_keys_len,puVar21,nonce_len,
                           (uchar *)0x0,0,(uchar *)0x0,0,
                           (wally_tx_output *)(local_a0 + (long)&local_88->outputs->satoshi),
                           SUB41(local_74,0));
        free_parent = SUB81(puVar10,0);
        if (iVar6 != 0) goto LAB_0010f294;
        local_88->num_outputs = local_88->num_outputs + 1;
        puVar19 = (uint32_t *)((uchar *)(sVar7 + (long)bytes_00) + uVar2);
        local_a0 = local_a0 + 0x70;
      }
      if ((char)local_74 == '\0' && bVar11 == 0) {
        for (local_a0 = (uchar *)0x0; local_a0 != local_68; local_a0 = local_a0 + 1) {
          sVar7 = varint_from_bytes((uchar *)puVar19,&num_witnesses);
          puVar12 = local_a0;
          puVar19 = (uint32_t *)(sVar7 + (long)puVar19);
          if (num_witnesses != 0) {
            ppwVar14 = &local_88->inputs[(long)local_a0].witness;
            iVar6 = wally_tx_witness_stack_init_alloc(num_witnesses,ppwVar14);
            free_parent = SUB81(ppwVar14,0);
            if (iVar6 != 0) goto LAB_0010f294;
            for (uVar13 = 0; uVar13 < num_witnesses; uVar13 = uVar13 + 1) {
              sVar7 = varint_from_bytes((uchar *)puVar19,&issuance_amount_len);
              uVar15 = uVar13;
              iVar6 = wally_tx_witness_stack_set
                                (local_88->inputs[(long)puVar12].witness,uVar13,
                                 (uchar *)(sVar7 + (long)puVar19),issuance_amount_len);
              free_parent = (undefined1)uVar15;
              if (iVar6 != 0) goto LAB_0010f294;
              puVar19 = (uint32_t *)((uchar *)(sVar7 + (long)puVar19) + issuance_amount_len);
            }
          }
        }
      }
      local_88->locktime = *puVar19;
      iVar6 = 0;
      if ((flags & 2) != 0 && bVar11 == 0) {
        puVar19 = puVar19 + 1;
        lVar17 = 200;
        while (bVar22 = local_68 != (uchar *)0x0, local_68 = local_68 + -1, bVar22) {
          sVar7 = varint_from_bytes((uchar *)puVar19,&issuance_amount_len);
          puVar12 = (uchar *)((long)puVar19 + sVar7);
          puVar21 = puVar12 + issuance_amount_len;
          sVar7 = varint_from_bytes(puVar21,&inflation_keys_len);
          uVar16 = inflation_keys_len;
          puVar21 = puVar21 + sVar7;
          if (issuance_amount_len == 0) {
            puVar12 = (uchar *)0x0;
          }
          puVar10 = puVar21;
          if (inflation_keys_len == 0) {
            puVar10 = (uchar *)0x0;
          }
          iVar6 = tx_elements_input_issuance_proof_init
                            ((wally_tx_input *)((long)local_88->inputs + lVar17 + -200),puVar12,
                             issuance_amount_len,puVar10,inflation_keys_len);
          free_parent = SUB81(puVar12,0);
          if (iVar6 != 0) goto LAB_0010f294;
          puVar21 = puVar21 + uVar16;
          ppwVar14 = (wally_tx_witness_stack **)((long)local_88->inputs + lVar17 + -0x90);
          iVar6 = witness_stack_from_bytes(puVar21,ppwVar14,&nonce_len);
          free_parent = SUB81(ppwVar14,0);
          if (iVar6 != 0) goto LAB_0010f294;
          puVar21 = puVar21 + nonce_len;
          puVar12 = local_88->inputs->txhash + lVar17;
          iVar6 = witness_stack_from_bytes(puVar21,(wally_tx_witness_stack **)puVar12,&nonce_len);
          free_parent = SUB81(puVar12,0);
          if (iVar6 != 0) goto LAB_0010f294;
          puVar19 = (uint32_t *)(puVar21 + nonce_len);
          lVar17 = lVar17 + 0xd0;
        }
        lVar17 = 0;
        while (bVar22 = local_60 != 0, local_60 = local_60 - 1, bVar22) {
          sVar7 = varint_from_bytes((uchar *)puVar19,&issuance_amount_len);
          puVar12 = (uchar *)((long)puVar19 + sVar7);
          puVar21 = puVar12 + issuance_amount_len;
          sVar7 = varint_from_bytes(puVar21,&inflation_keys_len);
          uVar16 = inflation_keys_len;
          if (issuance_amount_len == 0) {
            puVar12 = (uchar *)0x0;
          }
          puVar10 = puVar21 + sVar7;
          if (inflation_keys_len == 0) {
            puVar10 = (uchar *)0x0;
          }
          iVar6 = tx_elements_output_proof_init
                            ((wally_tx_output *)((long)&local_88->outputs->satoshi + lVar17),puVar12
                             ,issuance_amount_len,puVar10,inflation_keys_len);
          free_parent = SUB81(puVar12,0);
          if (iVar6 != 0) {
LAB_0010f294:
            tx_free(local_88,(_Bool)free_parent);
            *local_50 = (wally_tx *)0x0;
            return iVar6;
          }
          puVar19 = (uint32_t *)(puVar21 + sVar7 + uVar16);
          lVar17 = lVar17 + 0x70;
        }
        iVar6 = 0;
      }
    }
  }
  return iVar6;
}

Assistant:

static int tx_from_bytes(const unsigned char *bytes, size_t bytes_len,
                         uint32_t flags, struct wally_tx **output)
{
    const unsigned char *p = bytes;
    const bool is_elements = flags & WALLY_TX_FLAG_USE_ELEMENTS;
    bool expect_witnesses;
    size_t i, j, num_inputs, num_outputs;
    uint64_t tmp, num_witnesses;
    int ret;
    struct wally_tx *result;

    TX_CHECK_OUTPUT;

    if (analyze_tx(bytes, bytes_len, flags, &num_inputs, &num_outputs,
                   &expect_witnesses) != WALLY_OK)
        return WALLY_EINVAL;

    ret = wally_tx_init_alloc(0, 0, num_inputs, num_outputs, output);
    if (ret != WALLY_OK)
        return ret;
    result = (struct wally_tx *)*output;

    p += uint32_from_le_bytes(p, &result->version);
    if (is_elements)
        p++; /* Skip witness flag */
    else if (expect_witnesses)
        p += 2; /* Skip flag bytes */
    p += varint_from_bytes(p, &tmp);

    for (i = 0; i < num_inputs; ++i) {
        const unsigned char *txhash = p, *script, *nonce = NULL, *entropy = NULL;
        const unsigned char *issuance_amount = NULL, *inflation_keys = NULL;
        uint32_t index, sequence;
        uint64_t script_len, issuance_amount_len = 0, inflation_keys_len = 0;
        p += WALLY_TXHASH_LEN;
        p += uint32_from_le_bytes(p, &index);
        p += varint_from_bytes(p, &script_len);
        script = p;
        p += script_len;
        p += uint32_from_le_bytes(p, &sequence);
        if (is_elements && !!(index & WALLY_TX_ISSUANCE_FLAG) && !is_coinbase_bytes(txhash, WALLY_TXHASH_LEN, index)) {
            nonce = p;
            p += WALLY_TX_ASSET_TAG_LEN;
            entropy = p;
            p += WALLY_TX_ASSET_TAG_LEN;
            issuance_amount = p;
            p += confidential_value_varint_from_bytes(p, &issuance_amount_len);
            inflation_keys = p;
            p += confidential_value_varint_from_bytes(p, &inflation_keys_len);
        }
        ret = tx_elements_input_init(txhash, WALLY_TXHASH_LEN, index, sequence,
                                     script_len ? script : NULL, script_len, NULL,
                                     nonce, nonce ? WALLY_TX_ASSET_TAG_LEN : 0,
                                     entropy, entropy ? WALLY_TX_ASSET_TAG_LEN : 0,
                                     issuance_amount_len ? issuance_amount : NULL, issuance_amount_len,
                                     inflation_keys_len ? inflation_keys : NULL, inflation_keys_len,
                                     NULL, 0, NULL, 0, NULL, &result->inputs[i], is_elements);
        if (ret != WALLY_OK)
            goto fail;
        result->num_inputs += 1;
    }

    p += varint_from_bytes(p, &tmp);
    for (i = 0; i < num_outputs; ++i) {
        const unsigned char *script, *asset = NULL, *value = NULL, *nonce = NULL;
        uint64_t satoshi = -1, script_len, asset_len = 0, value_len = 0, nonce_len = 0;
        if (is_elements) {
            asset = p;
            p += confidential_asset_varint_from_bytes(p, &asset_len);
            value = p;
            p += confidential_value_varint_from_bytes(p, &value_len);
            nonce = p;
            p += confidential_nonce_varint_from_bytes(p, &nonce_len);
        } else
            p += uint64_from_le_bytes(p, &satoshi);
        p += varint_from_bytes(p, &script_len);
        script = p;
        p += script_len;
        ret = tx_elements_output_init(satoshi, script_len ? script : NULL, script_len,
                                      asset_len ? asset : NULL, asset_len,
                                      value_len ? value : NULL, value_len,
                                      nonce_len ? nonce : NULL, nonce_len,
                                      NULL, 0, NULL, 0,
                                      &result->outputs[i], is_elements);
        if (ret != WALLY_OK)
            goto fail;
        result->num_outputs += 1;
    }

    if (expect_witnesses && !is_elements) {
        for (i = 0; i < num_inputs; ++i) {
            p += varint_from_bytes(p, &num_witnesses);
            if (!num_witnesses)
                continue;
            ret = wally_tx_witness_stack_init_alloc(num_witnesses,
                                                    &result->inputs[i].witness);
            if (ret != WALLY_OK)
                goto fail;

            for (j = 0; j < num_witnesses; ++j) {
                uint64_t witness_len;
                p += varint_from_bytes(p, &witness_len);
                ret = wally_tx_witness_stack_set(result->inputs[i].witness, j,
                                                 p, witness_len);
                if (ret != WALLY_OK)
                    goto fail;
                p += witness_len;
            }
        }
    }

    uint32_from_le_bytes(p, &result->locktime);

#ifdef BUILD_ELEMENTS

#define proof_from_bytes(dst, len) \
    p += varint_from_bytes(p, (len)); \
    (dst) = p; \
    p += *(len)

    if (expect_witnesses && is_elements) {
        p += sizeof(uint32_t);
        for (i = 0; i < num_inputs; ++i) {
            const unsigned char *issuance_amount_rangeproof, *inflation_keys_rangeproof;
            uint64_t issuance_amount_rangeproof_len, inflation_keys_rangeproof_len, offset;
            proof_from_bytes(issuance_amount_rangeproof, &issuance_amount_rangeproof_len);
            proof_from_bytes(inflation_keys_rangeproof, &inflation_keys_rangeproof_len);
            ret = tx_elements_input_issuance_proof_init(result->inputs + i,
                                                        issuance_amount_rangeproof_len ? issuance_amount_rangeproof : NULL,
                                                        issuance_amount_rangeproof_len,
                                                        inflation_keys_rangeproof_len ? inflation_keys_rangeproof : NULL,
                                                        inflation_keys_rangeproof_len);
            if (ret != WALLY_OK)
                goto fail;
            ret = witness_stack_from_bytes(p, &result->inputs[i].witness, &offset);
            if (ret != WALLY_OK)
                goto fail;
            p += offset;
            ret = witness_stack_from_bytes(p, &result->inputs[i].pegin_witness, &offset);
            if (ret != WALLY_OK)
                goto fail;
            p += offset;
        }

        for (i = 0; i < num_outputs; ++i) {
            const unsigned char *surjectionproof, *rangeproof;
            uint64_t surjectionproof_len, rangeproof_len;
            proof_from_bytes(surjectionproof, &surjectionproof_len);
            proof_from_bytes(rangeproof, &rangeproof_len);
            ret = tx_elements_output_proof_init(result->outputs + i,
                                                surjectionproof_len ? surjectionproof : NULL,
                                                surjectionproof_len,
                                                rangeproof_len ? rangeproof : NULL,
                                                rangeproof_len);
            if (ret != WALLY_OK)
                goto fail;
        }
    }

#undef proof_from_bytes

#endif /* BUILD_ELEMENTS */
    return WALLY_OK;
fail:
    tx_free(result, true);
    *output = NULL;
    return ret;
}